

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::get
          (FieldGeneratorMap *this,FieldDescriptor *field)

{
  FieldDescriptor *__s;
  char *pcVar1;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *this_00;
  FieldGenerator *pFVar2;
  int in_EDX;
  int extraout_EDX;
  LogFinisher local_51;
  LogMessage local_50 [56];
  
  __s = field;
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x86);
    __s = (FieldDescriptor *)
          google::protobuf::internal::LogMessage::operator<<
                    (local_50,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,(LogMessage *)__s);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
    in_EDX = extraout_EDX;
  }
  pcVar1 = FieldDescriptor::index(field,(char *)__s,in_EDX);
  this_00 = internal::
            scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
            ::operator[](&this->field_generators_,(long)(int)pcVar1);
  pFVar2 = internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::operator*(this_00)
  ;
  return pFVar2;
}

Assistant:

const FieldGenerator& FieldGeneratorMap::get(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}